

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

ssize_t Omega_h::gmsh::write(int __fd,void *__buf,size_t __n)

{
  int iVar1;
  I32 IVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  ssize_t extraout_RAX;
  undefined *puVar8;
  ulong uVar9;
  Int j;
  int iVar10;
  long lVar11;
  Int ent_dim;
  int iVar12;
  string *name;
  undefined4 in_register_0000003c;
  ostream *this;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  long local_158;
  Read<signed_char> d_class_dims;
  Read<signed_char> d_class_dims_1;
  HostRead<signed_char> h_class_dims;
  HostRead<int> h_class_ids;
  HostRead<int> h_ents2verts;
  HostRead<signed_char> h_class_dims_1;
  Write<double> local_a0;
  HostRead<double> h_coords;
  Write<signed_char> local_80;
  Reals d_coords;
  Write<int> local_60;
  Write<signed_char> local_50;
  Write<int> local_40;
  
  this = (ostream *)CONCAT44(in_register_0000003c,__fd);
  Omega_h::Mesh::comm((Mesh *)&h_class_dims);
  IVar2 = Comm::size((Comm *)h_class_dims.read_.write_.shared_alloc_.alloc);
  if (IVar2 != 1) {
    fail("assertion %s failed at %s +%d\n","mesh->comm()->size() == 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x2c6);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &h_class_dims.read_.write_.shared_alloc_.direct_ptr);
  std::operator<<(this,"$MeshFormat\n");
  poVar7 = std::operator<<(this,"2.2 0 ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,'\n');
  std::operator<<(this,"$EndMeshFormat\n");
  std::operator<<(this,"$Nodes\n");
  uVar3 = Omega_h::Mesh::nverts((Mesh *)__buf);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)this,uVar3);
  std::operator<<(poVar7,'\n');
  uVar4 = Omega_h::Mesh::dim((Mesh *)__buf);
  Omega_h::Mesh::coords((Mesh *)&d_coords);
  Write<double>::Write(&local_a0,(Write<double> *)&d_coords);
  HostRead<double>::HostRead(&h_coords,(Read<signed_char> *)&local_a0);
  Write<double>::~Write(&local_a0);
  lVar11 = *(long *)this;
  lVar13 = *(long *)(lVar11 + -0x18);
  *(uint *)(this + lVar13 + 0x18) = *(uint *)(this + lVar13 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(this + *(long *)(lVar11 + -0x18) + 8) = 0x11;
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
  }
  local_158 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  uVar14 = 0;
  while (uVar14 != uVar3) {
    uVar14 = uVar14 + 1;
    std::ostream::operator<<((ostream *)this,(int)uVar14);
    lVar11 = local_158;
    uVar16 = uVar9;
    while (bVar17 = uVar16 != 0, uVar16 = uVar16 - 1, uVar5 = uVar4, bVar17) {
      std::operator<<(this,' ');
      std::ostream::_M_insert<double>
                (*(double *)((long)h_coords.read_.write_.shared_alloc_.direct_ptr + lVar11));
      lVar11 = lVar11 + 8;
    }
    for (; (int)uVar5 < 3; uVar5 = uVar5 + 1) {
      std::operator<<(this," 0");
    }
    local_158 = local_158 + (long)(int)uVar4 * 8;
    std::operator<<(this,'\n');
  }
  std::operator<<(this,"$EndNodes\n");
  std::operator<<(this,"$Elements\n");
  iVar1 = *__buf;
  iVar10 = 0;
  for (uVar3 = 0; ent_dim = (Int)__buf, (int)uVar3 <= (int)uVar4; uVar3 = uVar3 + 1) {
    uVar5 = Omega_h::Mesh::nents((Mesh *)__buf,uVar3);
    std::__cxx11::string::string((string *)&h_class_dims,"class_dim",(allocator *)&d_class_dims_1);
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&d_class_dims,ent_dim,(string *)(ulong)uVar3);
    std::__cxx11::string::~string((string *)&h_class_dims);
    Write<signed_char>::Write(&local_80,&d_class_dims.write_);
    HostRead<signed_char>::HostRead(&h_class_dims,(Read<signed_char> *)&local_80);
    Write<signed_char>::~Write(&local_80);
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      iVar10 = iVar10 + (uint)(uVar3 == (int)*(char *)((long)h_class_dims.read_.write_.shared_alloc_
                                                             .direct_ptr + uVar9));
    }
    Write<signed_char>::~Write((Write<signed_char> *)&h_class_dims);
    Write<signed_char>::~Write(&d_class_dims.write_);
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)this,iVar10);
  std::operator<<(poVar7,'\n');
  iVar10 = 0;
  name = (string *)0x0;
  do {
    uVar3 = (uint)name;
    if ((int)uVar4 < (int)uVar3) {
      std::operator<<(this,"$EndElements\n");
      Write<double>::~Write((Write<double> *)&h_coords);
      Write<double>::~Write(&d_coords.write_);
      return extraout_RAX;
    }
    uVar5 = Omega_h::Mesh::nents((Mesh *)__buf,uVar3);
    std::__cxx11::string::string((string *)&h_class_dims,"class_id",(allocator *)&d_class_dims_1);
    Omega_h::Mesh::get_array<int>((Mesh *)&d_class_dims,ent_dim,name);
    std::__cxx11::string::~string((string *)&h_class_dims);
    std::__cxx11::string::string((string *)&h_class_dims,"class_dim",(allocator *)&h_class_ids);
    Omega_h::Mesh::get_array<signed_char>((Mesh *)&d_class_dims_1,ent_dim,name);
    std::__cxx11::string::~string((string *)&h_class_dims);
    Omega_h::Mesh::ask_verts_of((Mesh *)&h_class_dims,ent_dim);
    Write<int>::Write(&local_40,(Write<int> *)&d_class_dims);
    HostRead<int>::HostRead(&h_class_ids,(Read<signed_char> *)&local_40);
    Write<int>::~Write(&local_40);
    Write<signed_char>::Write(&local_50,&d_class_dims_1.write_);
    HostRead<signed_char>::HostRead(&h_class_dims_1,(Read<signed_char> *)&local_50);
    Write<signed_char>::~Write(&local_50);
    Write<int>::Write(&local_60,(Write<int> *)&h_class_dims);
    HostRead<int>::HostRead(&h_ents2verts,(Read<signed_char> *)&local_60);
    Write<int>::~Write(&local_60);
    if (iVar1 == 0) {
      uVar6 = uVar3 + 1;
      if (3 < uVar3) {
        uVar6 = 0xffffffff;
      }
    }
    else {
      uVar6 = 0xffffffff;
      if (uVar3 < 4) {
        uVar6 = *(uint *)(&DAT_0037807c + (long)name * 4);
      }
    }
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    uVar14 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar14 = 0;
    }
    lVar11 = 0;
    for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      if (uVar3 == (int)*(char *)((long)h_class_dims_1.read_.write_.shared_alloc_.direct_ptr +
                                 uVar16)) {
        iVar10 = iVar10 + 1;
        std::ostream::operator<<((ostream *)this,iVar10);
        poVar7 = std::operator<<(this,' ');
        if (iVar1 == 1) {
          puVar8 = &DAT_0037dd50;
joined_r0x0029c941:
          iVar12 = -1;
          if (uVar3 < 4) {
            iVar12 = *(int *)(puVar8 + (long)name * 4);
          }
        }
        else {
          iVar12 = -1;
          if (iVar1 == 0) {
            puVar8 = &DAT_0037dd40;
            goto joined_r0x0029c941;
          }
        }
        std::ostream::operator<<((ostream *)poVar7,iVar12);
        std::operator<<(this," 2");
        iVar12 = *(int *)((long)h_class_ids.read_.write_.shared_alloc_.direct_ptr + uVar16 * 4);
        poVar7 = std::operator<<(this,' ');
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar12);
        poVar7 = std::operator<<(poVar7,' ');
        std::ostream::operator<<((ostream *)poVar7,iVar12);
        lVar13 = lVar11;
        uVar15 = uVar9;
        while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
          poVar7 = std::operator<<(this,' ');
          std::ostream::operator<<
                    ((ostream *)poVar7,
                     *(int *)((long)h_ents2verts.read_.write_.shared_alloc_.direct_ptr + lVar13) + 1
                    );
          lVar13 = lVar13 + 4;
        }
        std::operator<<(this,'\n');
      }
      lVar11 = lVar11 + (long)(int)uVar6 * 4;
    }
    Write<int>::~Write((Write<int> *)&h_ents2verts);
    Write<signed_char>::~Write((Write<signed_char> *)&h_class_dims_1);
    Write<int>::~Write((Write<int> *)&h_class_ids);
    Write<int>::~Write((Write<int> *)&h_class_dims);
    Write<signed_char>::~Write(&d_class_dims_1.write_);
    Write<int>::~Write((Write<int> *)&d_class_dims);
    name = (string *)(ulong)(uVar3 + 1);
  } while( true );
}

Assistant:

void write(std::ostream& stream, Mesh* mesh) {
  OMEGA_H_CHECK(mesh->comm()->size() == 1);
  stream << "$MeshFormat\n";
  stream << "2.2 0 " << sizeof(Real) << '\n';
  stream << "$EndMeshFormat\n";
  stream << "$Nodes\n";
  auto nverts = mesh->nverts();
  stream << nverts << '\n';
  auto dim = mesh->dim();
  auto d_coords = mesh->coords();
  auto h_coords = HostRead<Real>(d_coords);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < nverts; ++i) {
    stream << (i + 1);
    for (Int j = 0; j < dim; ++j) stream << ' ' << h_coords[i * dim + j];
    for (Int j = dim; j < 3; ++j) stream << " 0";
    stream << '\n';
  }
  stream << "$EndNodes\n";
  stream << "$Elements\n";
  LO gmsh_elem_i = 0;
  auto family = mesh->family();
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] == ent_dim) ++gmsh_elem_i;
    }
  }
  auto gmsh_nelems = gmsh_elem_i;
  stream << gmsh_nelems << '\n';
  gmsh_elem_i = 0;
  for (Int ent_dim = VERT; ent_dim <= dim; ++ent_dim) {
    auto nents = mesh->nents(ent_dim);
    auto d_class_ids = mesh->get_array<ClassId>(ent_dim, "class_id");
    auto d_class_dims = mesh->get_array<Byte>(ent_dim, "class_dim");
    auto d_ents2verts = mesh->ask_verts_of(ent_dim);
    auto h_class_ids = HostRead<ClassId>(d_class_ids);
    auto h_class_dims = HostRead<Byte>(d_class_dims);
    auto h_ents2verts = HostRead<LO>(d_ents2verts);
    auto deg = element_degree(family, ent_dim, VERT);
    for (LO i = 0; i < nents; ++i) {
      if (h_class_dims[i] != ent_dim) continue;
      stream << ++gmsh_elem_i;
      stream << ' ' << gmsh_type(family, ent_dim);
      stream << " 2";
      auto class_id = h_class_ids[i];
      stream << ' ' << class_id << ' ' << class_id;
      for (Int j = 0; j < deg; ++j) {
        stream << ' ' << (h_ents2verts[i * deg + j] + 1);
      }
      stream << '\n';
    }
  }
  stream << "$EndElements\n";
}